

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O0

void * __thiscall
LdConfigDirWrapper::getFieldPtr(LdConfigDirWrapper *this,size_t fId,size_t subField)

{
  Executable *pEVar1;
  int iVar2;
  offset_t oVar3;
  bufsize_t bVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  offset_t hdrSize;
  offset_t fieldDelta;
  bool is32b;
  size_t subField_local;
  size_t fId_local;
  LdConfigDirWrapper *this_local;
  
  iVar2 = (*(((this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
              super_ExeElementWrapper.m_Exe)->super_AbstractByteBuffer)._vptr_AbstractByteBuffer
            [0xb])();
  oVar3 = _getFieldDelta((bool)(-(iVar2 == 0x20) & 1),fId);
  if (oVar3 == 0xffffffffffffffff) {
    this_local = (LdConfigDirWrapper *)0x0;
  }
  else {
    bVar4 = getHdrDefinedSize(this);
    if (oVar3 < bVar4) {
      pEVar1 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
               super_ExeElementWrapper.m_Exe;
      iVar2 = (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x11])();
      iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[7])
                        (pEVar1,CONCAT44(extraout_var,iVar2) + oVar3,1,0);
      this_local = (LdConfigDirWrapper *)CONCAT44(extraout_var_00,iVar2);
    }
    else {
      this_local = (LdConfigDirWrapper *)0x0;
    }
  }
  return this_local;
}

Assistant:

void* LdConfigDirWrapper::getFieldPtr(size_t fId, size_t subField)
{
    const bool is32b = (m_Exe->getBitMode() == Executable::BITS_32) ? true : false;
    
    offset_t fieldDelta = _getFieldDelta(is32b, fId);
    if (fieldDelta != INVALID_ADDR) {
        const offset_t hdrSize = this->getHdrDefinedSize();
        if (fieldDelta >= hdrSize) {
            return NULL;
        }
        return m_Exe->getContentAt(this->getOffset() + fieldDelta, 1);
    }
    return NULL;
}